

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O3

DishType __thiscall Restaurant::findMyType(Restaurant *this,string *strType)

{
  int iVar1;
  DishType DVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)strType);
  if (iVar1 == 0) {
    DVar2 = ALC;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)strType);
    if (iVar1 == 0) {
      DVar2 = VEG;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)strType);
      DVar2 = BVG - (iVar1 == 0);
    }
  }
  return DVar2;
}

Assistant:

DishType Restaurant::findMyType(std::string strType)
{
    if(strType == "ALC")
        return ALC;
    if(strType == "VEG")
        return VEG;
    if(strType == "SPC")
        return SPC;
    else
        return BVG;
}